

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

string_view __thiscall slang::parsing::Trivia::getRawText(Trivia *this)

{
  string_view sVar1;
  Trivia *this_local;
  char *local_10;
  
  if ((byte)(this->kind - SkippedTokens) < 3) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,"");
  }
  else if ((this->hasFullLocation & 1U) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,
               (this->field_0).rawText.ptr,(ulong)(this->field_0).rawText.len);
  }
  else {
    this_local = (Trivia *)((this->field_0).syntaxNode)->parent;
    local_10 = *(char **)&((this->field_0).syntaxNode)->kind;
  }
  sVar1._M_str = local_10;
  sVar1._M_len = (size_t)this_local;
  return sVar1;
}

Assistant:

string_view Trivia::getRawText() const {
    switch (kind) {
        case TriviaKind::Directive:
        case TriviaKind::SkippedSyntax:
        case TriviaKind::SkippedTokens:
            return "";
        default:
            if (hasFullLocation)
                return fullLocation->text;
            return {rawText.ptr, rawText.len};
    }
}